

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newtonmin.c
# Opt level: O2

double modelhess(double *A,int N,double *dx,double eps,double *L)

{
  ulong uVar1;
  int iVar2;
  double *array;
  ulong uVar3;
  double *pdVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  
  if (eps < 0.0) {
    dVar12 = sqrt(eps);
  }
  else {
    dVar12 = SQRT(eps);
  }
  lVar10 = (long)N;
  array = (double *)malloc(lVar10 * 8 * lVar10);
  uVar3 = 0;
  uVar8 = 0;
  if (0 < N) {
    uVar8 = (ulong)(uint)N;
  }
  uVar1 = (ulong)(uint)N;
  pdVar4 = A;
  for (; uVar3 != uVar8; uVar3 = uVar3 + 1) {
    for (uVar6 = 0; uVar1 != uVar6; uVar6 = uVar6 + 1) {
      pdVar4[uVar6] = pdVar4[uVar6] / (dx[uVar3] * dx[uVar6]);
    }
    pdVar4 = pdVar4 + lVar10;
  }
  iVar5 = N + 1;
  iVar2 = 0;
  for (uVar3 = 0; uVar8 != uVar3; uVar3 = uVar3 + 1) {
    array[uVar3] = A[iVar2];
    iVar2 = iVar2 + iVar5;
  }
  dVar13 = array_max(array,N);
  dVar14 = array_min(array,N);
  for (uVar3 = 0; uVar8 != uVar3; uVar3 = uVar3 + 1) {
    array[uVar3] = 0.0;
  }
  dVar16 = 0.0;
  dVar15 = dVar13;
  if (dVar13 <= 0.0) {
    dVar15 = 0.0;
  }
  if (dVar14 <= dVar12 * dVar15) {
    dVar16 = ((dVar15 - dVar14) + (dVar15 - dVar14)) * dVar12 - dVar14;
    dVar13 = dVar13 + dVar16;
  }
  iVar2 = 0;
  pdVar4 = A;
  for (uVar3 = 0; uVar3 != uVar8; uVar3 = uVar3 + 1) {
    for (uVar6 = 0; uVar1 != uVar6; uVar6 = uVar6 + 1) {
      if (uVar3 < uVar6) {
        array[iVar2] = pdVar4[uVar6];
        iVar2 = iVar2 + 1;
      }
    }
    pdVar4 = pdVar4 + lVar10;
  }
  dVar14 = array_max_abs(array,iVar2);
  dVar15 = (dVar12 + dVar12 + 1.0) * dVar14;
  if (dVar13 < dVar15) {
    dVar16 = dVar16 + (dVar12 + dVar12) * dVar14 + (dVar14 - dVar13);
    dVar13 = dVar15;
  }
  if ((dVar13 == 0.0) && (!NAN(dVar13))) {
    dVar16 = 1.0;
  }
  if ((dVar13 == 0.0) && (!NAN(dVar13))) {
    dVar13 = 1.0;
  }
  if (0.0 < dVar16) {
    iVar2 = 0;
    uVar3 = uVar8;
    while (bVar11 = uVar3 != 0, uVar3 = uVar3 - 1, bVar11) {
      A[iVar2] = A[iVar2] + dVar16;
      iVar2 = iVar2 + iVar5;
    }
  }
  if (dVar13 <= dVar14 / (double)N) {
    dVar13 = dVar14 / (double)N;
  }
  if (dVar13 < 0.0) {
    dVar13 = sqrt(dVar13);
  }
  else {
    dVar13 = SQRT(dVar13);
  }
  dVar13 = cholmod(A,N,L,eps,dVar13);
  if (0.0 < dVar13) {
    dVar14 = *A;
    iVar2 = 1;
    uVar3 = 0;
    pdVar4 = A;
    dVar15 = dVar14;
    while (uVar3 != uVar8) {
      lVar9 = (long)iVar2;
      dVar16 = 0.0;
      for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
        dVar16 = dVar16 + ABS(pdVar4[uVar6]);
      }
      for (; lVar9 < lVar10; lVar9 = lVar9 + 1) {
        dVar16 = dVar16 + ABS(pdVar4[lVar9]);
      }
      dVar17 = dVar16 + A[uVar3 + (long)((int)uVar3 * N)];
      if (dVar17 <= dVar14) {
        dVar17 = dVar14;
      }
      dVar14 = dVar17;
      dVar16 = A[uVar3 + (long)((int)uVar3 * N)] - dVar16;
      if (dVar15 <= dVar16) {
        dVar16 = dVar15;
      }
      dVar15 = dVar16;
      iVar2 = iVar2 + 1;
      pdVar4 = pdVar4 + lVar10;
      uVar3 = uVar3 + 1;
    }
    dVar15 = (dVar14 - dVar15) * dVar12 - dVar15;
    dVar12 = 0.0;
    if (0.0 <= dVar15) {
      dVar12 = dVar15;
    }
    if (dVar13 <= dVar12) {
      dVar12 = dVar13;
    }
    iVar2 = 0;
    uVar3 = uVar8;
    while (bVar11 = uVar3 != 0, uVar3 = uVar3 - 1, bVar11) {
      A[iVar2] = A[iVar2] + dVar12;
      iVar2 = iVar2 + iVar5;
    }
  }
  dVar12 = cholmod(A,N,L,eps,0.0);
  for (uVar3 = 0; uVar3 != uVar8; uVar3 = uVar3 + 1) {
    for (uVar6 = 0; uVar1 != uVar6; uVar6 = uVar6 + 1) {
      A[uVar6] = dx[uVar3] * dx[uVar6] * A[uVar6];
    }
    A = A + lVar10;
  }
  lVar9 = 1;
  for (uVar3 = 0; uVar3 != uVar8; uVar3 = uVar3 + 1) {
    for (lVar7 = 0; lVar9 != lVar7; lVar7 = lVar7 + 1) {
      L[lVar7] = dx[uVar3] * L[lVar7];
    }
    lVar9 = lVar9 + 1;
    L = L + lVar10;
  }
  free(array);
  return dVar12;
}

Assistant:

double modelhess(double *A,int N,double *dx,double eps,double *L) {
	/*
	 * Algorithm 5.5.1 Dennis, Schnabel, Numerical Methods for Unconstrained Optimization and 
	 * Non-Linear Equations
	 */ 
	 double *U22;
	 double sqrteps,maxdiag,mindiag,maxposdiag,u;
	 double maxoffdiag,maxinp,maxadd;
	 double maxev,minev,offrow,sdd;
	 int step,i,j,k;
	 
	 sqrteps = sqrt(eps);
	 
	 U22 = (double*) malloc(sizeof(double) * N * N);
	 
	//scale
	
	for(i = 0;i < N;++i) {
		step = i*N;
		for(j = 0;j < N;++j) {
			A[step+j] /= (dx[i] * dx[j]);
		}
	}
	
	for(i = 0; i < N;++i) {
		U22[i] = A[i+i*N];
	}
	
	maxdiag = array_max(U22,N);
	mindiag = array_min(U22,N);
	
	maxposdiag = 0.0;
	
	if (maxdiag > maxposdiag) {
		maxposdiag = maxdiag;
	}
	
	for(i = 0; i < N;++i) {
		U22[i] = 0.0;
	}
	u = 0.0;
	if (mindiag <= sqrteps*maxposdiag) {
		u = 2 * (maxposdiag - mindiag) * sqrteps - mindiag;
		maxdiag += u;
	}
	k = 0;
	for (i = 0; i < N;++i) {
		for(j = 0;j < N;++j) {
			if (j > i) {
				U22[k] = A[i*N+j];
				k++;
			}
		}
	}
	
	maxoffdiag = array_max_abs(U22,k);
	
	if ( maxoffdiag*(1+2*sqrteps) > maxdiag) {
		u += (maxoffdiag - maxdiag) + 2*sqrteps*maxoffdiag;
		maxdiag = maxoffdiag*(1+2*sqrteps);
	}
	
	if (maxdiag == 0) {
		u = 1;
		maxdiag = 1;
	}
	
	if (u > 0) {
		for(i=0;i < N;++i) {
			A[i*N+i] += u;
		}
	}
	
	if (maxdiag > maxoffdiag / N) {
		maxinp = sqrt(maxdiag);
	} else {
		maxinp = sqrt(maxoffdiag / N);
	}
	
	maxadd = cholmod(A,N,L,eps,maxinp);
	
	if (maxadd > 0) {
		maxev = minev = A[0];
		for(i = 0; i < N;++i) {
			offrow = 0.0;
			step = i*N;
			
			for(j = 0; j < i;++j) {
				offrow += fabs(A[step+j]);
			}
			
			for(j = i+1; j < N;++j) {
				offrow += fabs(A[step+j]);
			}
			
			if (maxev < A[step+i] + offrow) {
				maxev = A[step+i] + offrow;
			}
			if (minev > A[step+i] - offrow) {
				minev = A[step+i] - offrow;
			}
			
		}
		sdd = (maxev - minev) * sqrteps - minev;
		if (sdd < 0) {
			sdd = 0;
		}
		if (maxadd > sdd) {
			u = sdd;
		} else {
			u = maxadd;
		}
		
		for(i = 0; i < N;++i) {
			A[i*N+i] += u; 
		}
	}
	
	maxadd = cholmod(A,N,L,eps,0.0);
	
	//unscale
	
	for(i = 0;i < N;++i) {
		step = i*N;
		for(j = 0;j < N;++j) {
			A[step+j] *= (dx[i] * dx[j]);
		}
	}
	
	for(i = 0;i < N;++i) {
		step = i*N;
		for(j = 0;j < i+1;++j) {
			L[step+j] *= dx[i];
		}
	}
	
	free(U22);
	
	return maxadd;
	 
}